

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O3

void __thiscall EmitPrettyPrint::~EmitPrettyPrint(EmitPrettyPrint *this)

{
  int *piVar1;
  pointer pcVar2;
  pointer piVar3;
  
  (this->super_EmitXml)._vptr_EmitXml = (_func_int **)&PTR__EmitPrettyPrint_003c9f98;
  if (this->lowlevel != (EmitXml *)0x0) {
    (*this->lowlevel->_vptr_EmitXml[1])();
  }
  circularqueue<TokenSplit>::~circularqueue(&this->tokqueue);
  piVar1 = (this->scanqueue).cache;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  pcVar2 = (this->commentfill)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->commentfill).field_2) {
    operator_delete(pcVar2);
  }
  piVar3 = (this->indentstack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
    return;
  }
  return;
}

Assistant:

EmitPrettyPrint::~EmitPrettyPrint(void)

{
  delete lowlevel;
}